

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O2

void __thiscall
CompressedArray::find_best_radix_parameters
          (CompressedArray *this,vector<Record,_std::allocator<Record>_> *records)

{
  long lVar1;
  pointer pRVar2;
  pointer puVar3;
  pointer pRVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  pointer pRVar8;
  pointer pRVar9;
  long lVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  CompressedArray *pCVar13;
  long lVar14;
  uint32_t uVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar16;
  uint32_t uVar17;
  allocator_type local_d9;
  CompressedArray *local_d8;
  CompressedArray *local_d0;
  CompressedArray *local_c8;
  ulong local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> unique_continuations_count_index_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> continuations_count_index_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ngram_count_index_size;
  value_type_conflict4 local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> context_index_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> context_index_diff_size;
  
  context_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&context_index_diff_size,8,(value_type_conflict4 *)&context_index_size,
             (allocator_type *)&ngram_count_index_size);
  ngram_count_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&context_index_size,8,(value_type_conflict4 *)&ngram_count_index_size,
             (allocator_type *)&continuations_count_index_size);
  continuations_count_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&ngram_count_index_size,8,(value_type_conflict4 *)&continuations_count_index_size,
             (allocator_type *)&unique_continuations_count_index_size);
  unique_continuations_count_index_size.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&continuations_count_index_size,8,
             (value_type_conflict4 *)&unique_continuations_count_index_size,
             (allocator_type *)&local_68);
  local_68 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&unique_continuations_count_index_size,8,&local_68,&local_d9);
  local_c8 = (CompressedArray *)&this->ngram_count_values;
  local_d0 = (CompressedArray *)&this->continuations_count_values;
  local_d8 = (CompressedArray *)&this->unique_continuations_count_values;
  local_c0 = 1;
  while( true ) {
    pRVar4 = (records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pCVar13 = (CompressedArray *)0x14;
    if ((ulong)(((long)(records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pRVar4) / 0x14) <= local_c0) break;
    pRVar2 = pRVar4 + local_c0;
    pRVar8 = pRVar4 + local_c0;
    pRVar9 = pRVar4 + local_c0;
    pRVar4 = pRVar4 + local_c0;
    lVar10 = 0;
    while (lVar10 != 8) {
      uVar12 = (pRVar2->key).context_index;
      if (pRVar2[-1].key.word_index == (pRVar2->key).word_index) {
        uVar12 = uVar12 - pRVar2[-1].key.context_index;
        pvVar16 = &context_index_diff_size;
      }
      else {
        pvVar16 = &context_index_size;
      }
      uVar12 = calculate_number_size(pCVar13,uVar12,(int)lVar10 + 1);
      puVar3 = (pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar10;
      *puVar3 = *puVar3 + (ulong)uVar12;
      pCVar13 = local_c8;
      uVar12 = Vocabulary<unsigned_int>::get_index
                         ((Vocabulary<unsigned_int> *)local_c8,&(pRVar8->value).ngram_count);
      uVar11 = (uint32_t)(lVar10 + 1);
      uVar12 = calculate_number_size(pCVar13,uVar12,uVar11);
      ngram_count_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar10] =
           ngram_count_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar10] + (ulong)uVar12;
      pCVar13 = local_d0;
      uVar12 = Vocabulary<unsigned_int>::get_index
                         ((Vocabulary<unsigned_int> *)local_d0,&(pRVar9->value).continuations_count)
      ;
      uVar12 = calculate_number_size(pCVar13,uVar12,uVar11);
      continuations_count_index_size.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] =
           continuations_count_index_size.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10] + (ulong)uVar12;
      pCVar13 = local_d8;
      uVar12 = Vocabulary<unsigned_int>::get_index
                         ((Vocabulary<unsigned_int> *)local_d8,
                          &(pRVar4->value).unique_continuations_count);
      uVar12 = calculate_number_size(pCVar13,uVar12,uVar11);
      unique_continuations_count_index_size.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] =
           unique_continuations_count_index_size.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10] + (ulong)uVar12;
      lVar10 = lVar10 + 1;
    }
    local_c0 = local_c0 + 1;
  }
  this->word_index_diff_log_radix = 2;
  this->context_index_diff_log_radix = 1;
  this->context_index_log_radix = 1;
  this->ngram_count_index_log_radix = 1;
  this->continuations_count_index_log_radix = 1;
  this->unique_continuations_count_index_log_radix = 1;
  uVar12 = 1;
  lVar14 = 0;
  uVar15 = 1;
  uVar11 = 1;
  uVar17 = 1;
  local_c8 = (CompressedArray *)
             ngram_count_index_size.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_d0 = (CompressedArray *)
             continuations_count_index_size.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_d8 = (CompressedArray *)
             unique_continuations_count_index_size.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  lVar10 = 1;
  do {
    local_c0 = (ulong)((int)lVar10 - 1);
    lVar10 = 0;
    do {
      if (lVar14 + lVar10 == 8) {
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&unique_continuations_count_index_size.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&continuations_count_index_size.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&ngram_count_index_size.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&context_index_size.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&context_index_diff_size.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        return;
      }
      iVar5 = (int)lVar14;
      iVar6 = (int)lVar10;
      if (context_index_diff_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar14 + lVar10] <
          context_index_diff_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar17 - 1]) {
        uVar17 = iVar5 + iVar6 + 1;
        this->context_index_diff_log_radix = uVar17;
      }
      if (context_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar14 + lVar10] <
          context_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11 - 1]) {
        uVar11 = iVar5 + iVar6 + 1;
        this->context_index_log_radix = uVar11;
      }
      if (ngram_count_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar14 + lVar10] <
          ngram_count_index_size.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15 - 1]) {
        uVar15 = iVar5 + iVar6 + 1;
        this->ngram_count_index_log_radix = uVar15;
      }
      if (continuations_count_index_size.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14 + lVar10] <
          continuations_count_index_size.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12 - 1]) {
        uVar12 = iVar5 + iVar6 + 1;
        this->continuations_count_index_log_radix = uVar12;
      }
      lVar1 = lVar10 + 1;
      lVar7 = lVar14 + lVar10;
      lVar10 = lVar1;
    } while (unique_continuations_count_index_size.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[local_c0] <=
             unique_continuations_count_index_size.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7]);
    lVar14 = lVar14 + lVar1;
    this->unique_continuations_count_index_log_radix = (uint32_t)lVar14;
    lVar10 = lVar14;
  } while( true );
}

Assistant:

void CompressedArray::find_best_radix_parameters(const vector<Record>& records) {
    vector<uint64_t> context_index_diff_size(8, 0);
    vector<uint64_t> context_index_size(8, 0);
    vector<uint64_t> ngram_count_index_size(8, 0);
    vector<uint64_t> continuations_count_index_size(8, 0);
    vector<uint64_t> unique_continuations_count_index_size(8, 0);

    for (size_t i = 1; i < records.size(); i++) {
        const Record& record = records[i];
        const Record& prev_record = records[i - 1];

        for (uint32_t j = 0; j < 8; j++) {
            if (prev_record.key.word_index == record.key.word_index) {
                uint32_t diff = record.key.context_index - prev_record.key.context_index;
                context_index_diff_size[j] += calculate_number_size(diff, j + 1);
            } else {
                context_index_size[j] += calculate_number_size(record.key.context_index, j + 1);
            }

            uint32_t index = ngram_count_values.get_index(record.value.ngram_count);
            ngram_count_index_size[j] += calculate_number_size(index, j + 1);
            index = continuations_count_values.get_index(record.value.continuations_count);
            continuations_count_index_size[j] += calculate_number_size(index, j + 1);
            index = unique_continuations_count_values.get_index(record.value.unique_continuations_count);
            unique_continuations_count_index_size[j] += calculate_number_size(index, j + 1);
        }
    }

    word_index_diff_log_radix = 2;
    context_index_diff_log_radix = 1;
    context_index_log_radix = 1;
    ngram_count_index_log_radix = 1;
    continuations_count_index_log_radix = 1;
    unique_continuations_count_index_log_radix = 1;
    for (uint32_t j = 0; j < 8; j++) {
        if (context_index_diff_size[context_index_diff_log_radix - 1] >
                context_index_diff_size[j])
            context_index_diff_log_radix = j + 1;
        if (context_index_size[context_index_log_radix - 1] >
                context_index_size[j])
            context_index_log_radix = j + 1;
        if (ngram_count_index_size[ngram_count_index_log_radix - 1] >
                ngram_count_index_size[j])
            ngram_count_index_log_radix = j + 1;
        if (continuations_count_index_size[continuations_count_index_log_radix - 1] >
                continuations_count_index_size[j])
            continuations_count_index_log_radix = j + 1;
        if (unique_continuations_count_index_size[unique_continuations_count_index_log_radix - 1] >
                unique_continuations_count_index_size[j])
            unique_continuations_count_index_log_radix = j + 1;
    }
}